

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O3

int Io_WriteMoPlaOneInt(FILE *pFile,Abc_Ntk_t *pNtk,DdManager *dd,Vec_Ptr_t *vFuncs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  char *pcVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  int i;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  DdNode *zCover0;
  DdNode *zCover1;
  DdNode *local_70;
  DdNode *local_40;
  DdNode *local_38;
  
  uVar1 = vFuncs->nSize;
  if (uVar1 != pNtk->vCos->nSize) {
    __assert_fail("Vec_PtrSize(vFuncs) == Abc_NtkCoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                  ,0xd9,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  uVar2 = dd->size;
  if (uVar2 != pNtk->vCis->nSize) {
    __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                  ,0xda,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  if (1000 < (int)uVar2) {
    __assert_fail("dd->size <= 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                  ,0xdb,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  if ((int)uVar1 < 2) {
    __assert_fail("nOutputs > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                  ,0xe0,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  uVar10 = 0;
  do {
    Cudd_bddNewVarAtLevel(dd,uVar10);
    uVar10 = uVar10 + 1;
  } while (uVar1 != uVar10);
  if (dd->size != uVar1 + uVar2) {
    __assert_fail("dd->size == nInputs + nOutputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                  ,0xe5,"int Io_WriteMoPlaOneInt(FILE *, Abc_Ntk_t *, DdManager *, Vec_Ptr_t *)");
  }
  local_70 = Cudd_ReadLogicZero(dd);
  Cudd_Ref(local_70);
  pDVar4 = Cudd_ReadLogicZero(dd);
  Cudd_Ref(pDVar4);
  uVar12 = 0;
  do {
    if ((long)vFuncs->nSize <= (long)uVar12) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pDVar7 = (DdNode *)vFuncs->pArray[uVar12];
    i = (int)uVar12 + uVar2;
    pDVar5 = Cudd_bddIthVar(dd,i);
    pDVar5 = Cudd_bddAnd(dd,pDVar5,pDVar7);
    Cudd_Ref(pDVar5);
    uVar11 = 0;
    do {
      pDVar6 = pDVar5;
      if (uVar12 != uVar11) {
        pDVar6 = Cudd_bddIthVar(dd,uVar2 + (int)uVar11);
        pDVar6 = Cudd_bddAnd(dd,pDVar5,(DdNode *)((ulong)pDVar6 ^ 1));
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(dd,pDVar5);
      }
      uVar11 = uVar11 + 1;
      pDVar5 = pDVar6;
    } while (uVar1 != (uint)uVar11);
    pDVar5 = Cudd_bddOr(dd,local_70,pDVar6);
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(dd,local_70);
    Cudd_RecursiveDeref(dd,pDVar6);
    pDVar6 = Cudd_bddIthVar(dd,i);
    pDVar7 = Cudd_bddAnd(dd,pDVar6,(DdNode *)((ulong)pDVar7 ^ 1));
    Cudd_Ref(pDVar7);
    pDVar6 = Cudd_bddOr(dd,pDVar4,pDVar7);
    Cudd_Ref(pDVar6);
    Cudd_RecursiveDeref(dd,pDVar4);
    Cudd_RecursiveDeref(dd,pDVar7);
    printf("Trying %d output.\n",uVar12 & 0xffffffff);
    uVar10 = Cudd_DagSize(pDVar5);
    printf("Onset = %d nodes.\n",(ulong)uVar10);
    uVar10 = Cudd_DagSize(pDVar6);
    printf("Offset = %d nodes.\n",(ulong)uVar10);
    uVar12 = uVar12 + 1;
    pDVar4 = pDVar6;
    local_70 = pDVar5;
  } while (uVar12 != uVar1);
  Cudd_zddVarsFromBddVars(dd,2);
  pDVar4 = Cudd_zddIsop(dd,pDVar6,(DdNode *)((ulong)pDVar5 ^ 1),&local_40);
  Cudd_Ref(local_40);
  Cudd_Ref(pDVar4);
  Cudd_RecursiveDeref(dd,pDVar4);
  uVar10 = Abc_CountZddCubes(dd,local_40);
  pDVar4 = Cudd_zddIsop(dd,pDVar5,(DdNode *)((ulong)pDVar6 ^ 1),&local_38);
  Cudd_Ref(local_38);
  Cudd_Ref(pDVar4);
  Cudd_RecursiveDeref(dd,pDVar4);
  uVar3 = Abc_CountZddCubes(dd,local_38);
  pDVar4 = local_38;
  if ((int)uVar10 < (int)uVar3) {
    pDVar4 = local_40;
    local_40 = local_38;
  }
  if ((int)uVar3 < (int)uVar10) {
    uVar10 = uVar3;
  }
  Cudd_RecursiveDerefZdd(dd,local_40);
  Cudd_RecursiveDeref(dd,pDVar5);
  Cudd_RecursiveDeref(dd,pDVar6);
  Cudd_RecursiveDerefZdd(dd,pDVar4);
  uVar3 = Cudd_DagSize(pDVar4);
  printf("Cover = %d nodes.\n",(ulong)uVar3);
  printf("ISOP = %d\n",(ulong)uVar10);
  fprintf((FILE *)pFile,".i %d\n",(ulong)uVar2);
  fprintf((FILE *)pFile,".o %d\n",(ulong)uVar1);
  fwrite(".ilb",4,1,(FILE *)pFile);
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pcVar8 = Abc_ObjName((Abc_Obj_t *)pVVar9->pArray[lVar13]);
      fprintf((FILE *)pFile," %s",pcVar8);
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar13 < pVVar9->nSize);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".ob",3,1,(FILE *)pFile);
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pcVar8 = Abc_ObjName((Abc_Obj_t *)pVVar9->pArray[lVar13]);
      fprintf((FILE *)pFile," %s",pcVar8);
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar13 < pVVar9->nSize);
  }
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".p %d\n",(ulong)uVar10);
  fwrite(".e\n",3,1,(FILE *)pFile);
  return 1;
}

Assistant:

int Io_WriteMoPlaOneInt( FILE * pFile, Abc_Ntk_t * pNtk, DdManager * dd, Vec_Ptr_t * vFuncs )
{
    Abc_Obj_t * pNode;
    DdNode * bOnset, * bOffset, * bCube, * bFunc, * bTemp, * zCover;
    int i, k, nInputs, nOutputs;
    int nCubes, fPhase;

    assert( Vec_PtrSize(vFuncs) == Abc_NtkCoNum(pNtk) );
    assert( dd->size == Abc_NtkCiNum(pNtk) );
    assert( dd->size <= 1000 );

    // collect the parameters
    nInputs   = Abc_NtkCiNum(pNtk);
    nOutputs  = Abc_NtkCoNum(pNtk);
    assert( nOutputs > 1 );

    // create extra variables
    for ( i = 0; i < nOutputs; i++ )
        Cudd_bddNewVarAtLevel( dd, i );
    assert( dd->size == nInputs + nOutputs );

    // create ON and OFF sets
    bOnset = Cudd_ReadLogicZero( dd );  Cudd_Ref(bOnset);
    bOffset = Cudd_ReadLogicZero( dd ); Cudd_Ref(bOffset);
    for ( i = 0; i < nOutputs; i++ )
    {
        bFunc = (DdNode *)Vec_PtrEntry(vFuncs, i);
        // create onset
        bCube = Cudd_bddAnd( dd, Cudd_bddIthVar(dd, nInputs+i), bFunc );  Cudd_Ref(bCube);
        for ( k = 0; k < nOutputs; k++ ) 
            if ( k != i )
            {
                bCube = Cudd_bddAnd( dd, bTemp = bCube, Cudd_Not(Cudd_bddIthVar(dd, nInputs+k)) );  Cudd_Ref(bCube);
                Cudd_RecursiveDeref( dd, bTemp );
            }
        bOnset = Cudd_bddOr( dd, bTemp = bOnset, bCube );   Cudd_Ref(bOnset);
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        // create offset
        bCube = Cudd_bddAnd( dd, Cudd_bddIthVar(dd, nInputs+i), Cudd_Not(bFunc) );  Cudd_Ref(bCube);
        bOffset = Cudd_bddOr( dd, bTemp = bOffset, bCube );                         Cudd_Ref(bOffset);
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );

        printf( "Trying %d output.\n", i );
        printf( "Onset = %d nodes.\n", Cudd_DagSize(bOnset) );
        printf( "Offset = %d nodes.\n", Cudd_DagSize(bOffset) );
    }

    Cudd_zddVarsFromBddVars( dd, 2 );

    // derive ISOP
    {
        extern int Abc_CountZddCubes( DdManager * dd, DdNode * zCover );
        DdNode * bCover, * zCover0, * zCover1;
        int nCubes0, nCubes1;
        // get the ZDD of the negative polarity
        bCover = Cudd_zddIsop( dd, bOffset, Cudd_Not(bOnset), &zCover0 );
        Cudd_Ref( zCover0 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes0 = Abc_CountZddCubes( dd, zCover0 );

        // get the ZDD of the positive polarity
        bCover = Cudd_zddIsop( dd, bOnset, Cudd_Not(bOffset), &zCover1 );
        Cudd_Ref( zCover1 );
        Cudd_Ref( bCover );
        Cudd_RecursiveDeref( dd, bCover );
        nCubes1 = Abc_CountZddCubes( dd, zCover1 );

        // compare the number of cubes
        if ( nCubes1 <= nCubes0 )
        { // use positive polarity
            nCubes = nCubes1;
            zCover = zCover1;
            Cudd_RecursiveDerefZdd( dd, zCover0 );
            fPhase = 1;
        }
        else
        { // use negative polarity
            nCubes = nCubes0;
            zCover = zCover0;
            Cudd_RecursiveDerefZdd( dd, zCover1 );
            fPhase = 0;
        }
    }
    Cudd_RecursiveDeref( dd, bOnset );
    Cudd_RecursiveDeref( dd, bOffset );
    Cudd_RecursiveDerefZdd( dd, zCover );
    printf( "Cover = %d nodes.\n", Cudd_DagSize(zCover) );
    printf( "ISOP = %d\n", nCubes );

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", nOutputs );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    Abc_NtkForEachCo( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nCubes );


    fprintf( pFile, ".e\n" );
    return 1;
}